

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O2

void basic_test(void)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string asStack_428 [32];
  ostringstream oss;
  ostringstream ss;
  string local_118 [32];
  string local_f8 [32];
  cookie c;
  
  std::__cxx11::string::string(local_f8,"a",(allocator *)&ss);
  std::__cxx11::string::string(local_118,"b",(allocator *)&oss);
  cppcms::http::cookie::cookie(&c,local_f8,local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x2c);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::httponly(SUB81(&c,0));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; HttpOnly; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x32);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::samesite_none(SUB81(&c,0));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; HttpOnly; SameSite=None; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x38);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=None; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::samesite_lax(SUB81(&c,0));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; HttpOnly; SameSite=Lax; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3e);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=Lax; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::samesite_strict(SUB81(&c,0));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; HttpOnly; SameSite=Strict; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x44);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=Strict; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::httponly(SUB81(&c,0));
  cppcms::http::cookie::samesite_strict(SUB81(&c,0));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x4b);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::max_age((uint)&c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; Max-Age=10; Version=1");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x51);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Max-Age=10; Version=1\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  cppcms::http::cookie::expires((long)&c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  cppcms::http::operator<<((ostream *)&ss,&c);
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "Set-Cookie:a=b; Max-Age=10; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1"
                         );
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    cppcms::http::cookie::browser_age();
    cppcms::http::operator<<((ostream *)&ss,&c);
    std::__cxx11::stringbuf::str();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"Set-Cookie:a=b; Version=1");
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x5d);
      std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,asStack_428);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    cppcms::http::cookie::expires((long)&c);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    cppcms::http::operator<<((ostream *)&ss,&c);
    std::__cxx11::stringbuf::str();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"Set-Cookie:a=b; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1")
    ;
    std::__cxx11::string::~string((string *)&oss);
    if (bVar1) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      cppcms::http::cookie::~cookie(&c);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,99);
    std::operator<<(poVar2,
                    " ss.str()==\"Set-Cookie:a=b; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1\""
                   );
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,asStack_428);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x57);
  std::operator<<(poVar2,
                  " ss.str()==\"Set-Cookie:a=b; Max-Age=10; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1\""
                 );
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,asStack_428);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void basic_test()
{
	cppcms::http::cookie c("a","b");
	{
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.httponly(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; Version=1");
	}
	{
		c.samesite_none(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=None; Version=1");
	}
	{
		c.samesite_lax(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=Lax; Version=1");
	}
	{
		c.samesite_strict(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=Strict; Version=1");
	}
	{
		c.httponly(false);
		c.samesite_strict(false);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.max_age(10);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Max-Age=10; Version=1");
	}
	{
		c.expires(1);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Max-Age=10; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1");
	}
	{
		std::ostringstream ss;
		c.browser_age();
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.expires(1);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1");
	}
}